

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O1

pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> * __thiscall
docopt::Command::single_match
          (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *__return_storage_ptr__,
          Command *this,PatternList *left)

{
  pointer pbVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer __n;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  pointer psVar8;
  unsigned_long uVar9;
  bool bVar10;
  pointer local_a8;
  pointer local_a0;
  undefined1 local_98 [16];
  element_type *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_80 [2];
  undefined1 local_70 [8];
  undefined1 local_68 [32];
  Command *local_48;
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *local_40;
  undefined1 local_31;
  
  __return_storage_ptr__->first = 0;
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lVar7 = (long)(left->
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(left->
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  local_40 = __return_storage_ptr__;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 4;
    psVar8 = (left->
             super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar9 = 0;
    local_48 = this;
    do {
      peVar2 = (psVar8->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar2 == (element_type *)0x0) {
        lVar6 = 0;
      }
      else {
        lVar6 = __dynamic_cast(peVar2,&Pattern::typeinfo,&Argument::typeinfo,0);
      }
      if (lVar6 != 0) {
        iVar5 = (*(local_48->super_Argument).super_LeafPattern.super_Pattern._vptr_Pattern[3])();
        lVar7 = *(long *)CONCAT44(extraout_var,iVar5);
        local_a8 = (pointer)local_98;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,lVar7,((long *)CONCAT44(extraout_var,iVar5))[1] + lVar7);
        __n = local_a0;
        pbVar1 = (pointer)(local_68 + 0x10);
        local_70._0_4_ = String;
        if (local_a8 == (pointer)local_98) {
          local_68._24_8_ = local_98._8_8_;
          local_68._0_8_ = pbVar1;
        }
        else {
          local_68._0_8_ = local_a8;
        }
        local_68._8_8_ = local_a0;
        local_a0 = (pointer)0x0;
        local_98[0] = 0;
        if ((*(int *)(lVar6 + 0x28) == 3) && (__n == *(pointer *)(lVar6 + 0x38))) {
          if (__n == (pointer)0x0) {
            bVar10 = true;
            local_a8 = (pointer)local_98;
          }
          else {
            local_a8 = (pointer)local_98;
            iVar5 = bcmp((void *)local_68._0_8_,*(void **)(lVar6 + 0x30),(size_t)__n);
            bVar10 = iVar5 == 0;
          }
        }
        else {
          bVar10 = false;
          local_a8 = (pointer)local_98;
        }
        if (local_70._0_4_ == StringList) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68);
        }
        else if ((local_70._0_4_ == String) && ((pointer)local_68._0_8_ != pbVar1)) {
          operator_delete((void *)local_68._0_8_);
        }
        if (local_a8 != (pointer)local_98) {
          operator_delete(local_a8);
        }
        if (!bVar10) {
          return local_40;
        }
        local_40->first = uVar9;
        iVar5 = (*(local_48->super_Argument).super_LeafPattern.super_Pattern._vptr_Pattern[3])();
        local_70._0_4_ = Bool;
        local_68[0] = 1;
        local_88 = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<docopt::Command,std::allocator<docopt::Command>,std::__cxx11::string_const&,docopt::value>
                  (a_Stack_80,(Command **)&local_88,(allocator<docopt::Command> *)&local_31,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar5),(value *)local_70);
        _Var4._M_pi = a_Stack_80[0]._M_pi;
        peVar3 = local_88;
        local_88 = (element_type *)0x0;
        a_Stack_80[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = (local_40->second).
                  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        (local_40->second).super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = peVar3;
        (local_40->second).super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var4._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (a_Stack_80[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_80[0]._M_pi);
        }
        if (local_70._0_4_ == StringList) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68);
          return local_40;
        }
        if (local_70._0_4_ != String) {
          return local_40;
        }
        if ((pointer)local_68._0_8_ == pbVar1) {
          return local_40;
        }
        operator_delete((void *)local_68._0_8_);
        return local_40;
      }
      uVar9 = uVar9 + 1;
      psVar8 = psVar8 + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != uVar9);
  }
  return local_40;
}

Assistant:

inline std::pair<size_t, std::shared_ptr<LeafPattern>> Command::single_match(PatternList const& left) const
	{
		std::pair<size_t, std::shared_ptr<LeafPattern>> ret {};

		for(size_t i = 0, size = left.size(); i < size; ++i)
		{
			auto arg = dynamic_cast<Argument const*>(left[i].get());
			if (arg) {
				if (name() == arg->getValue()) {
					ret.first = i;
					ret.second = std::make_shared<Command>(name(), value{true});
				}
				break;
			}
		}

		return ret;
	}